

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
cfd::core::RandomNumberUtil::GetRandomBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,int len)

{
  int iVar1;
  result_type rVar2;
  size_type __n;
  result_type_conflict rVar3;
  uint32_t *puVar4;
  reference __dest;
  undefined4 local_3c;
  int local_38;
  uint32_t random_1;
  int remainder;
  uint32_t random;
  int i;
  int index;
  int local_14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_10;
  int len_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  
  local_14 = len;
  pvStack_10 = __return_storage_ptr__;
  if ((GetRandomBytes(int)::rd == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetRandomBytes(int)::rd), iVar1 != 0)) {
    std::random_device::random_device(&GetRandomBytes::rd);
    __cxa_atexit(std::random_device::~random_device,&GetRandomBytes::rd,&__dso_handle);
    __cxa_guard_release(&GetRandomBytes(int)::rd);
  }
  if ((GetRandomBytes(int)::engine == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetRandomBytes(int)::engine), iVar1 != 0)) {
    rVar2 = std::random_device::operator()(&GetRandomBytes::rd);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine(&GetRandomBytes::engine,(ulong)rVar2);
    __cxa_guard_release(&GetRandomBytes(int)::engine);
  }
  i._3_1_ = 0;
  __n = (size_type)local_14;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&i + 2));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,__n,
             (allocator<unsigned_char> *)((long)&i + 2));
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&i + 2));
  random = 0;
  for (remainder = 0; remainder < local_14 / 4; remainder = remainder + 1) {
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&GetRandomBytes::engine);
    random_1 = (uint32_t)rVar3;
    puVar4 = (uint32_t *)
             ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        __return_storage_ptr__,(long)(int)random);
    *puVar4 = random_1;
    random = random + 4;
  }
  local_38 = local_14 % 4;
  if (local_38 != 0) {
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&GetRandomBytes::engine);
    local_3c = (undefined4)rVar3;
    __dest = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        __return_storage_ptr__,(long)(int)random);
    memcpy(__dest,&local_3c,(long)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> RandomNumberUtil::GetRandomBytes(int len) {
#if defined(_WIN32) && defined(__GNUC__) && (__GNUC__ < 9)
  // for mingw gcc lower 9
  static std::mt19937 engine(static_cast<unsigned int>(time(nullptr)));
#else
  static std::random_device rd;
  static std::mt19937 engine(rd());
#endif
  std::vector<uint8_t> result(len);

  int index = 0;
  for (int i = 0; i < len / 4; i++) {
    uint32_t random = engine();
    memcpy(&result[index], reinterpret_cast<uint8_t *>(&random), 4);
    index += 4;
  }

  int remainder = len % 4;
  if (remainder != 0) {
    uint32_t random = engine();
    memcpy(&result[index], reinterpret_cast<uint8_t *>(&random), remainder);
  }

  return result;
}